

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O0

bool __thiscall gnilk::LogManager::RemoveSink(LogManager *this,string *name)

{
  bool bVar1;
  const_iterator local_70;
  undefined4 local_64;
  __normal_iterator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_*,_std::vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>_>
  local_60 [3];
  string *local_48;
  unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_> *local_40;
  __normal_iterator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_*,_std::vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>_>
  local_38;
  __normal_iterator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_*,_std::vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>_>
  local_30;
  __normal_iterator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_*,_std::vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>_>
  itSink;
  lock_guard<std::mutex> lock;
  string *name_local;
  LogManager *this_local;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&itSink,&this->sinkLock);
  local_38._M_current =
       (unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_> *)
       std::
       vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
       ::begin(&this->sinks);
  local_40 = (unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_> *)
             std::
             vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
             ::end(&this->sinks);
  local_48 = name;
  local_30 = std::
             find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<gnilk::LogSinkInstance,std::default_delete<gnilk::LogSinkInstance>>*,std::vector<std::unique_ptr<gnilk::LogSinkInstance,std::default_delete<gnilk::LogSinkInstance>>,std::allocator<std::unique_ptr<gnilk::LogSinkInstance,std::default_delete<gnilk::LogSinkInstance>>>>>,gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::__0>
                       (local_38,(__normal_iterator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_*,_std::vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>_>
                                  )local_40,(anon_class_8_1_898f2789_for__M_pred)name);
  local_60[0]._M_current =
       (unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_> *)
       std::
       vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
       ::end(&this->sinks);
  bVar1 = __gnu_cxx::
          operator==<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_*,_std::vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>_>
                    (&local_30,local_60);
  if (!bVar1) {
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<gnilk::LogSinkInstance,std::default_delete<gnilk::LogSinkInstance>>const*,std::vector<std::unique_ptr<gnilk::LogSinkInstance,std::default_delete<gnilk::LogSinkInstance>>,std::allocator<std::unique_ptr<gnilk::LogSinkInstance,std::default_delete<gnilk::LogSinkInstance>>>>>
    ::
    __normal_iterator<std::unique_ptr<gnilk::LogSinkInstance,std::default_delete<gnilk::LogSinkInstance>>*>
              ((__normal_iterator<std::unique_ptr<gnilk::LogSinkInstance,std::default_delete<gnilk::LogSinkInstance>>const*,std::vector<std::unique_ptr<gnilk::LogSinkInstance,std::default_delete<gnilk::LogSinkInstance>>,std::allocator<std::unique_ptr<gnilk::LogSinkInstance,std::default_delete<gnilk::LogSinkInstance>>>>>
                *)&local_70,&local_30);
    std::
    vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
    ::erase(&this->sinks,local_70);
  }
  this_local._7_1_ = !bVar1;
  local_64 = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&itSink);
  return this_local._7_1_;
}

Assistant:

bool LogManager::RemoveSink(const std::string &name) {
    std::lock_guard<std::mutex> lock(sinkLock);

    auto itSink = std::find_if(sinks.begin(), sinks.end(), [&name](const LogSinkInstance::Ref &other)->bool {
        return (other->GetName() == name);
    });

    if (itSink == sinks.end()) {
        return false;
    }
    sinks.erase(itSink);
    return true;
}